

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_synth.cc
# Opt level: O3

int main(int argc,char **argv)

{
  double __x;
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  pointer pdVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  size_t sVar11;
  ostream *poVar12;
  double *pdVar13;
  long lVar14;
  int read_size;
  char *__s;
  string *input_stream;
  double dVar15;
  int fft_length;
  int frame_shift;
  vector<double,_std::allocator<double>_> f0;
  int tmp;
  double sampling_rate;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  aperiodicity;
  vector<double,_std::allocator<double>_> waveform;
  ostringstream error_message;
  WorldSynthesis world_synthesis;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  spectrum;
  int local_498;
  int local_494;
  InputOutputFormats local_490;
  int local_48c;
  vector<double,_std::allocator<double>_> local_488;
  double local_470;
  SpectrumToSpectrum local_468;
  double local_420;
  string local_418;
  char *local_3f8;
  ulong local_3f0;
  vector<double,_std::allocator<double>_> local_3e8;
  string local_3c8;
  byte abStack_3a8 [80];
  ios_base local_358 [408];
  undefined1 local_1c0 [16];
  double local_1b0 [12];
  ios_base local_150 [264];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  
  local_498 = 0x400;
  local_494 = 0x50;
  local_420 = 16.0;
  local_3f0 = 0;
  local_490 = kLogAmplitudeSpectrumInDecibels;
  local_48c = 0;
LAB_00103860:
  while (iVar10 = ya_getopt_long(argc,argv,"l:p:s:F:S:A:h",(option *)0x0,(int *)0x0), 0x6b < iVar10)
  {
    if (iVar10 == 0x73) {
      std::__cxx11::string::string((string *)&local_3c8,ya_optarg,(allocator *)local_1c0);
      bVar8 = sptk::ConvertStringToDouble(&local_3c8,&local_420);
      if (!bVar8) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
          operator_delete(local_3c8._M_dataplus._M_p);
        }
        goto LAB_00103f76;
      }
      bVar8 = sptk::IsInRange(local_420,8.0,98.0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p);
      }
      if (!bVar8) {
LAB_00103f76:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_3c8,"The argument for the -s option must be in a number ",0x33)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_3c8,"in the interval [",0x11);
        poVar12 = std::ostream::_M_insert<double>(8.0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
        poVar12 = std::ostream::_M_insert<double>(98.0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"]",1);
        local_1c0._0_8_ = local_1b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"world_synth","");
        sptk::PrintErrorMessage((string *)local_1c0,(ostringstream *)&local_3c8);
LAB_001044ff:
        if ((double *)local_1c0._0_8_ != local_1b0) {
          operator_delete((void *)local_1c0._0_8_);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_3c8);
        std::ios_base::~ios_base(local_358);
        return 1;
      }
    }
    else if (iVar10 == 0x70) {
      std::__cxx11::string::string((string *)&local_3c8,ya_optarg,(allocator *)local_1c0);
      bVar7 = sptk::ConvertStringToInteger(&local_3c8,&local_494);
      bVar8 = local_494 < 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p);
      }
      if (!bVar7 || bVar8) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_3c8,"The argument for the -p option must be a positive integer"
                   ,0x39);
        local_1c0._0_8_ = local_1b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"world_synth","");
        sptk::PrintErrorMessage((string *)local_1c0,(ostringstream *)&local_3c8);
        goto LAB_001044ff;
      }
    }
    else {
      if (iVar10 != 0x6c) goto LAB_00103b84;
      std::__cxx11::string::string((string *)&local_3c8,ya_optarg,(allocator *)local_1c0);
      bVar7 = sptk::ConvertStringToInteger(&local_3c8,&local_498);
      bVar8 = local_498 < 0x200;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p);
      }
      if (!bVar7 || bVar8) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_3c8,"The argument for the -l option must be at least 512",0x33)
        ;
        local_1c0._0_8_ = local_1b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"world_synth","");
        sptk::PrintErrorMessage((string *)local_1c0,(ostringstream *)&local_3c8);
        goto LAB_001044ff;
      }
    }
  }
  if (0x45 < iVar10) {
    if (iVar10 != 0x46) {
      if (iVar10 != 0x53) {
        if (iVar10 == 0x68) {
          anon_unknown.dwarf_416d::PrintUsage((ostream *)&std::cout);
          return 0;
        }
LAB_00103b84:
        anon_unknown.dwarf_416d::PrintUsage((ostream *)&std::cerr);
        return 1;
      }
      std::__cxx11::string::string((string *)&local_3c8,ya_optarg,(allocator *)local_1c0);
      bVar8 = sptk::ConvertStringToInteger(&local_3c8,(int *)&local_468);
      if (bVar8) {
        bVar8 = sptk::IsInRange((InputOutputFormats)local_468._vptr_SpectrumToSpectrum,0,3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
          operator_delete(local_3c8._M_dataplus._M_p);
        }
        if (bVar8) {
          local_490 = (InputOutputFormats)local_468._vptr_SpectrumToSpectrum;
          goto LAB_00103860;
        }
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_3c8,"The argument for the -S option must be an integer ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_3c8,"in the range of ",0x10);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)&local_3c8,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," to ",4);
      std::ostream::operator<<((ostream *)poVar12,3);
      local_1c0._0_8_ = local_1b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"world_synth","");
      sptk::PrintErrorMessage((string *)local_1c0,(ostringstream *)&local_3c8);
      goto LAB_001044ff;
    }
    std::__cxx11::string::string((string *)&local_3c8,ya_optarg,(allocator *)local_1c0);
    bVar8 = sptk::ConvertStringToInteger(&local_3c8,(int *)&local_468);
    if (bVar8) {
      bVar8 = sptk::IsInRange((InputOutputFormats)local_468._vptr_SpectrumToSpectrum,0,2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p);
      }
      if (bVar8) {
        local_48c = (InputOutputFormats)local_468._vptr_SpectrumToSpectrum;
        goto LAB_00103860;
      }
    }
    else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_3c8,"The argument for the -F option must be an integer ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_3c8,"in the range of ",0x10);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&local_3c8,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," to ",4);
    std::ostream::operator<<((ostream *)poVar12,2);
    local_1c0._0_8_ = local_1b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"world_synth","");
    sptk::PrintErrorMessage((string *)local_1c0,(ostringstream *)&local_3c8);
    goto LAB_001044ff;
  }
  if (iVar10 != -1) {
    if (iVar10 != 0x41) goto LAB_00103b84;
    std::__cxx11::string::string((string *)&local_3c8,ya_optarg,(allocator *)local_1c0);
    bVar8 = sptk::ConvertStringToInteger(&local_3c8,(int *)&local_468);
    if (bVar8) {
      bVar8 = sptk::IsInRange((InputOutputFormats)local_468._vptr_SpectrumToSpectrum,0,3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p);
      }
      if (bVar8) {
        local_3f0 = (ulong)local_468._vptr_SpectrumToSpectrum & 0xffffffff;
        goto LAB_00103860;
      }
    }
    else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_3c8,"The argument for the -A option must be an integer ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_3c8,"in the range of ",0x10);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&local_3c8,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," to ",4);
    std::ostream::operator<<((ostream *)poVar12,3);
    local_1c0._0_8_ = local_1b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"world_synth","");
    sptk::PrintErrorMessage((string *)local_1c0,(ostringstream *)&local_3c8);
    goto LAB_001044ff;
  }
  if (argc - ya_optind == 2) {
    lVar3 = (long)argc + -2;
    lVar4 = (long)argc + -1;
    __s = (char *)0x0;
  }
  else {
    if (argc - ya_optind != 3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_3c8,
                 "Just three input files, spfile, apfile, and f0file are required",0x3f);
      local_1c0._0_8_ = local_1b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"world_synth","");
      sptk::PrintErrorMessage((string *)local_1c0,(ostringstream *)&local_3c8);
      goto LAB_001044ff;
    }
    lVar14 = (long)argc;
    lVar3 = lVar14 + -3;
    lVar4 = lVar14 + -2;
    __s = argv[lVar14 + -1];
  }
  pcVar1 = argv[lVar3];
  pcVar2 = argv[lVar4];
  bVar8 = sptk::SetBinaryMode();
  iVar10 = local_498;
  if (!bVar8) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_3c8,"Cannot set translation mode",0x1b);
    local_1c0._0_8_ = local_1b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"world_synth","");
    sptk::PrintErrorMessage((string *)local_1c0,(ostringstream *)&local_3c8);
    goto LAB_001044ff;
  }
  local_470 = local_420;
  local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  input_stream = &local_3c8;
  std::ifstream::ifstream(input_stream);
  if ((__s != (char *)0x0) &&
     (std::ifstream::open((char *)&local_3c8,(_Ios_Openmode)__s),
     (abStack_3a8[*(long *)(local_3c8._M_dataplus._M_p + -0x18)] & 5) != 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"Cannot open file ",0x11);
    sVar11 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,__s,sVar11);
    local_468._vptr_SpectrumToSpectrum = (_func_int **)&local_468.output_format_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"world_synth","");
    sptk::PrintErrorMessage((string *)&local_468,(ostringstream *)local_1c0);
    if (local_468._vptr_SpectrumToSpectrum != (_func_int **)&local_468.output_format_) {
      operator_delete(local_468._vptr_SpectrumToSpectrum);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
    std::ios_base::~ios_base(local_150);
    std::ifstream::~ifstream(&local_3c8);
    iVar10 = 1;
    goto LAB_00104aa5;
  }
  local_3f8 = pcVar2;
  cVar9 = std::__basic_file<char>::is_open();
  if (cVar9 == '\0') {
    input_stream = (string *)&std::cin;
  }
  read_size = iVar10 / 2 + 1;
  local_470 = local_470 * 1000.0;
  while (bVar8 = sptk::ReadStream<double>((double *)local_1c0,(istream *)input_stream),
        pdVar5 = local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish, bVar8) {
    if (local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_488,
                 (iterator)
                 local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(double *)local_1c0);
    }
    else {
      *local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish = (double)local_1c0._0_8_;
      local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
  }
  pdVar13 = local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_48c == 2) {
    for (; pdVar13 != pdVar5; pdVar13 = pdVar13 + 1) {
      __x = *pdVar13;
      dVar15 = 0.0;
      if ((__x != -10000000000.0) || (NAN(__x))) {
        dVar15 = exp(__x);
      }
      *pdVar13 = dVar15;
    }
  }
  else if (local_48c == 0) {
    for (; pdVar13 !=
           local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish; pdVar13 = pdVar13 + 1) {
      *pdVar13 = (double)(~-(ulong)(*pdVar13 == 0.0) & (ulong)(local_470 / *pdVar13));
    }
  }
  std::ifstream::~ifstream(&local_3c8);
  if (local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    iVar10 = 0;
    goto LAB_00104aa5;
  }
  local_48.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::reserve(&local_48,
            (long)local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3);
  sptk::SpectrumToSpectrum::SpectrumToSpectrum
            (&local_468,local_498,local_490,kPowerSpectrum,0.0,-1.79769313486232e+308);
  if (local_468.is_valid_ == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_3c8,"FFT length must be a power of 2",0x1f);
    local_1c0._0_8_ = local_1b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"world_synth","");
    sptk::PrintErrorMessage((string *)local_1c0,(ostringstream *)&local_3c8);
    if ((double *)local_1c0._0_8_ != local_1b0) {
      operator_delete((void *)local_1c0._0_8_);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_3c8);
    std::ios_base::~ios_base(local_358);
    sptk::SpectrumToSpectrum::~SpectrumToSpectrum(&local_468);
    iVar10 = 1;
  }
  else {
    std::ifstream::ifstream(&local_3c8);
    std::ifstream::open((char *)&local_3c8,(_Ios_Openmode)pcVar1);
    if ((abStack_3a8[*(long *)(local_3c8._M_dataplus._M_p + -0x18)] & 5) == 0) {
      std::vector<double,_std::allocator<double>_>::vector
                (&local_3e8,(long)read_size,(allocator_type *)local_1c0);
      while (bVar8 = sptk::ReadStream<double>
                               (false,0,0,read_size,&local_3e8,(istream *)&local_3c8,(int *)0x0),
            bVar8) {
        bVar7 = sptk::SpectrumToSpectrum::Run(&local_468,&local_3e8);
        if (!bVar7) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1c0,"Failed to convert spectrum",0x1a);
          local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"world_synth","");
          sptk::PrintErrorMessage(&local_418,(ostringstream *)local_1c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p != &local_418.field_2) {
            operator_delete(local_418._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
          std::ios_base::~ios_base(local_150);
          iVar10 = 1;
          goto LAB_00104662;
        }
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::push_back(&local_48,&local_3e8);
      }
      iVar10 = 0;
LAB_00104662:
      if (local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      bVar8 = !bVar8;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c0,"Cannot open file ",0x11);
      std::operator<<((ostream *)local_1c0,pcVar1);
      local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"world_synth","");
      sptk::PrintErrorMessage(&local_418,(ostringstream *)local_1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != &local_418.field_2) {
        operator_delete(local_418._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
      std::ios_base::~ios_base(local_150);
      iVar10 = 1;
      bVar8 = false;
    }
    std::ifstream::~ifstream(&local_3c8);
    sptk::SpectrumToSpectrum::~SpectrumToSpectrum(&local_468);
    if (bVar8) {
      local_418._M_dataplus._M_p = (pointer)0x0;
      local_418._M_string_length = 0;
      local_418.field_2._M_allocated_capacity = 0;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::reserve((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)&local_418,
                (long)local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3);
      std::ifstream::ifstream(&local_3c8);
      uVar6 = local_3f0;
      std::ifstream::open((char *)&local_3c8,(_Ios_Openmode)local_3f8);
      if ((abStack_3a8[*(long *)(local_3c8._M_dataplus._M_p + -0x18)] & 5) == 0) {
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_1c0,(long)read_size,
                   (allocator_type *)&local_468);
        while (bVar8 = sptk::ReadStream<double>
                                 (false,0,0,read_size,(value_type *)local_1c0,(istream *)&local_3c8,
                                  (int *)0x0), bVar8) {
          iVar10 = (int)uVar6;
          pdVar13 = (double *)local_1c0._0_8_;
          if (iVar10 == 1) {
            for (; pdVar13 != (double *)local_1c0._8_8_; pdVar13 = pdVar13 + 1) {
              *pdVar13 = 1.0 - *pdVar13;
            }
          }
          else if (iVar10 == 2) {
            for (; pdVar13 != (double *)local_1c0._8_8_; pdVar13 = pdVar13 + 1) {
              *pdVar13 = *pdVar13 / (*pdVar13 + 1.0);
            }
          }
          else if (iVar10 == 3) {
            for (; pdVar13 != (double *)local_1c0._8_8_; pdVar13 = pdVar13 + 1) {
              *pdVar13 = 1.0 / (*pdVar13 + 1.0);
            }
          }
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)&local_418,(value_type *)local_1c0);
        }
        if ((double *)local_1c0._0_8_ != (double *)0x0) {
          operator_delete((void *)local_1c0._0_8_);
        }
        std::ifstream::~ifstream(&local_3c8);
        sptk::WorldSynthesis::WorldSynthesis
                  ((WorldSynthesis *)local_1c0,local_498,local_494,local_470);
        if (local_1b0[1]._0_1_ == '\0') {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3c8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_3c8,"Failed to initialize WorldSynthesis",0x23);
          local_468._vptr_SpectrumToSpectrum = (_func_int **)&local_468.output_format_;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"world_synth","");
          sptk::PrintErrorMessage((string *)&local_468,(ostringstream *)&local_3c8);
          if (local_468._vptr_SpectrumToSpectrum != (_func_int **)&local_468.output_format_) {
            operator_delete(local_468._vptr_SpectrumToSpectrum);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_3c8);
          std::ios_base::~ios_base(local_358);
          goto LAB_00104a80;
        }
        local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar8 = sptk::WorldSynthesis::Run
                          ((WorldSynthesis *)local_1c0,&local_488,&local_48,
                           (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)&local_418,&local_3e8);
        if (bVar8) {
          iVar10 = 0;
          bVar8 = sptk::WriteStream<double>
                            (0,(int)((ulong)((long)local_3e8.
                                                                                                      
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_3e8.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3),
                             &local_3e8,(ostream *)&std::cout,(int *)0x0);
          if (!bVar8) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3c8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_3c8,"Failed to write waveform",0x18);
            local_468._vptr_SpectrumToSpectrum = (_func_int **)&local_468.output_format_;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"world_synth","");
            sptk::PrintErrorMessage((string *)&local_468,(ostringstream *)&local_3c8);
            goto LAB_00104b11;
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3c8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_3c8,"Failed to synthesize waveform",0x1d);
          local_468._vptr_SpectrumToSpectrum = (_func_int **)&local_468.output_format_;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"world_synth","");
          sptk::PrintErrorMessage((string *)&local_468,(ostringstream *)&local_3c8);
LAB_00104b11:
          if (local_468._vptr_SpectrumToSpectrum != (_func_int **)&local_468.output_format_) {
            operator_delete(local_468._vptr_SpectrumToSpectrum);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_3c8);
          std::ios_base::~ios_base(local_358);
          iVar10 = 1;
        }
        if (local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_3e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c0,"Cannot open file ",0x11);
        std::operator<<((ostream *)local_1c0,local_3f8);
        local_468._vptr_SpectrumToSpectrum = (_func_int **)&local_468.output_format_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"world_synth","");
        sptk::PrintErrorMessage((string *)&local_468,(ostringstream *)local_1c0);
        if (local_468._vptr_SpectrumToSpectrum != (_func_int **)&local_468.output_format_) {
          operator_delete(local_468._vptr_SpectrumToSpectrum);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
        std::ios_base::~ios_base(local_150);
        std::ifstream::~ifstream(&local_3c8);
LAB_00104a80:
        iVar10 = 1;
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)&local_418);
    }
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_48);
LAB_00104aa5:
  if (local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_488.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
    return iVar10;
  }
  return iVar10;
}

Assistant:

int main(int argc, char* argv[]) {
  int fft_length(kDefaultFftLength);
  int frame_shift(kDefaultFrameShift);
  double sampling_rate(kDefaultSamplingRate);
  PitchFormats pitch_format(kDefaultPitchFormat);
  sptk::SpectrumToSpectrum::InputOutputFormats spectrum_format(
      kDefaultSpectrumFormat);
  AperiodicityFormats aperiodicity_format(kDefaultAperiodicityFormat);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:p:s:F:S:A:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &fft_length) ||
            fft_length < 512) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be at least 512";
          sptk::PrintErrorMessage("world_synth", error_message);
          return 1;
        }
        break;
      }
      case 'p': {
        if (!sptk::ConvertStringToInteger(optarg, &frame_shift) ||
            frame_shift <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -p option must be a positive integer";
          sptk::PrintErrorMessage("world_synth", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        const double min(8.0);
        const double max(98.0);
        if (!sptk::ConvertStringToDouble(optarg, &sampling_rate) ||
            !sptk::IsInRange(sampling_rate, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be in a number "
                        << "in the interval [" << min << ", " << max << "]";
          sptk::PrintErrorMessage("world_synth", error_message);
          return 1;
        }
        break;
      }
      case 'F': {
        const int min(0);
        const int max(static_cast<int>(kNumPitchFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -F option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("world_synth", error_message);
          return 1;
        }
        pitch_format = static_cast<PitchFormats>(tmp);
        break;
      }
      case 'S': {
        const int min(0);
        const int max(
            static_cast<int>(sptk::SpectrumToSpectrum::kNumInputOutputFormats) -
            1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -S option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("world_synth", error_message);
          return 1;
        }
        spectrum_format =
            static_cast<sptk::SpectrumToSpectrum::InputOutputFormats>(tmp);
        break;
      }
      case 'A': {
        const int min(0);
        const int max(static_cast<int>(kNumAperiodicityFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -A option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("world_synth", error_message);
          return 1;
        }
        aperiodicity_format = static_cast<AperiodicityFormats>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const char* spectrum_file;
  const char* aperiodicity_file;
  const char* f0_file;
  const int num_input_files(argc - optind);
  if (3 == num_input_files) {
    spectrum_file = argv[argc - 3];
    aperiodicity_file = argv[argc - 2];
    f0_file = argv[argc - 1];
  } else if (2 == num_input_files) {
    spectrum_file = argv[argc - 2];
    aperiodicity_file = argv[argc - 1];
    f0_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message
        << "Just three input files, spfile, apfile, and f0file are required";
    sptk::PrintErrorMessage("world_synth", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("world_synth", error_message);
    return 1;
  }
  const int spectrum_size(fft_length / 2 + 1);
  const double sampling_rate_in_hz(1000.0 * sampling_rate);

  std::vector<double> f0;
  {
    std::ifstream ifs;
    if (NULL != f0_file) {
      ifs.open(f0_file, std::ios::in | std::ios::binary);
      if (ifs.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << f0_file;
        sptk::PrintErrorMessage("world_synth", error_message);
        return 1;
      }
    }
    std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

    double tmp;
    while (sptk::ReadStream(&tmp, &input_stream)) {
      f0.push_back(tmp);
    }

    switch (pitch_format) {
      case kPitch: {
        std::transform(f0.begin(), f0.end(), f0.begin(),
                       [sampling_rate_in_hz](double x) {
                         return (0.0 == x) ? 0.0 : sampling_rate_in_hz / x;
                       });
        break;
      }
      case kF0: {
        // nothing to do
        break;
      }
      case kLogF0: {
        std::transform(f0.begin(), f0.end(), f0.begin(), [](double x) {
          return (sptk::kLogZero == x) ? 0.0 : std::exp(x);
        });
        break;
      }
      default: {
        break;
      }
    }
  }
  if (f0.empty()) return 0;

  std::vector<std::vector<double>> spectrum;
  spectrum.reserve(f0.size());
  {
    sptk::SpectrumToSpectrum spectrum_to_spectrum(
        fft_length,
        static_cast<sptk::SpectrumToSpectrum::InputOutputFormats>(
            spectrum_format),
        sptk::SpectrumToSpectrum::InputOutputFormats::kPowerSpectrum);
    if (!spectrum_to_spectrum.IsValid()) {
      std::ostringstream error_message;
      error_message << "FFT length must be a power of 2";
      sptk::PrintErrorMessage("world_synth", error_message);
      return 1;
    }

    std::ifstream ifs;
    ifs.open(spectrum_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << spectrum_file;
      sptk::PrintErrorMessage("world_synth", error_message);
      return 1;
    }
    std::istream& input_stream(ifs);

    std::vector<double> tmp(spectrum_size);
    while (sptk::ReadStream(false, 0, 0, spectrum_size, &tmp, &input_stream,
                            NULL)) {
      if (!spectrum_to_spectrum.Run(&tmp)) {
        std::ostringstream error_message;
        error_message << "Failed to convert spectrum";
        sptk::PrintErrorMessage("world_synth", error_message);
        return 1;
      }
      spectrum.push_back(tmp);
    }
  }

  std::vector<std::vector<double>> aperiodicity;
  aperiodicity.reserve(f0.size());
  {
    std::ifstream ifs;
    ifs.open(aperiodicity_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << aperiodicity_file;
      sptk::PrintErrorMessage("world_synth", error_message);
      return 1;
    }
    std::istream& input_stream(ifs);

    std::vector<double> tmp(spectrum_size);
    while (sptk::ReadStream(false, 0, 0, spectrum_size, &tmp, &input_stream,
                            NULL)) {
      switch (aperiodicity_format) {
        case kAperiodicity: {
          // nothing to do
          break;
        }
        case kPeriodicity: {
          std::transform(tmp.begin(), tmp.end(), tmp.begin(),
                         [](double p) { return 1.0 - p; });
          break;
        }
        case kAperiodicityOverPeriodicity: {
          std::transform(tmp.begin(), tmp.end(), tmp.begin(),
                         [](double ap) { return ap / (1.0 + ap); });
          break;
        }
        case kPeriodicityOverAperiodicity: {
          std::transform(tmp.begin(), tmp.end(), tmp.begin(),
                         [](double pa) { return 1.0 / (1.0 + pa); });
          break;
        }
        default: {
          break;
        }
      }
      aperiodicity.push_back(tmp);
    }
  }

  sptk::WorldSynthesis world_synthesis(fft_length, frame_shift,
                                       sampling_rate_in_hz);
  if (!world_synthesis.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize WorldSynthesis";
    sptk::PrintErrorMessage("world_synth", error_message);
    return 1;
  }

  std::vector<double> waveform;
  if (!world_synthesis.Run(f0, spectrum, aperiodicity, &waveform)) {
    std::ostringstream error_message;
    error_message << "Failed to synthesize waveform";
    sptk::PrintErrorMessage("world_synth", error_message);
    return 1;
  }

  if (!sptk::WriteStream(0, static_cast<int>(waveform.size()), waveform,
                         &std::cout, NULL)) {
    std::ostringstream error_message;
    error_message << "Failed to write waveform";
    sptk::PrintErrorMessage("world_synth", error_message);
    return 1;
  }

  return 0;
}